

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O2

void __thiscall absl::Mutex::ReaderLock(Mutex *this)

{
  ulong uVar1;
  GraphId id;
  bool bVar2;
  
  id = DebugOnlyDeadlockCheck(this);
  uVar1 = (this->mu_).super___atomic_base<long>._M_i;
  if ((uVar1 & 0x1c) == 0) {
    LOCK();
    bVar2 = uVar1 == (this->mu_).super___atomic_base<long>._M_i;
    if (bVar2) {
      (this->mu_).super___atomic_base<long>._M_i = (uVar1 | 1) + 0x100;
    }
    UNLOCK();
    if (bVar2) goto LAB_0013efcd;
  }
  LockSlow(this,(MuHow)kSharedS,(Condition *)0x0,0);
LAB_0013efcd:
  DebugOnlyLockEnter(this,id);
  return;
}

Assistant:

void Mutex::ReaderLock() {
  ABSL_TSAN_MUTEX_PRE_LOCK(this, __tsan_mutex_read_lock);
  GraphId id = DebugOnlyDeadlockCheck(this);
  intptr_t v = mu_.load(std::memory_order_relaxed);
  // try fast acquire, then slow loop
  if ((v & (kMuWriter | kMuWait | kMuEvent)) != 0 ||
      !mu_.compare_exchange_strong(v, (kMuReader | v) + kMuOne,
                                   std::memory_order_acquire,
                                   std::memory_order_relaxed)) {
    this->LockSlow(kShared, nullptr, 0);
  }
  DebugOnlyLockEnter(this, id);
  ABSL_TSAN_MUTEX_POST_LOCK(this, __tsan_mutex_read_lock, 0);
}